

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

void __thiscall TokenBuffer::fill(TokenBuffer *this,int amount)

{
  size_t sVar1;
  int in_ESI;
  RefCount<Token> *in_RDI;
  RefCount<Token> *in_stack_ffffffffffffffb8;
  TokenBuffer *in_stack_ffffffffffffffc0;
  CircularQueue<RefCount<Token>_> *this_00;
  
  syncConsume(in_stack_ffffffffffffffc0);
  while( true ) {
    sVar1 = CircularQueue<RefCount<Token>_>::entries((CircularQueue<RefCount<Token>_> *)0x296c0a);
    if ((ulong)(long)(in_ESI + *(int *)((long)&in_RDI[1].ref + 4)) <= sVar1) break;
    this_00 = (CircularQueue<RefCount<Token>_> *)(in_RDI + 3);
    (*(code *)in_RDI->ref->ptr->_vptr_Token)();
    CircularQueue<RefCount<Token>_>::append(this_00,in_stack_ffffffffffffffb8);
    RefCount<Token>::~RefCount(in_RDI);
  }
  return;
}

Assistant:

void TokenBuffer::fill(int amount)
{
	syncConsume();
	// Fill the buffer sufficiently to hold needed tokens
	while (queue.entries() < size_t(amount + markerOffset)) {
		// Append the next token
		queue.append(input.nextToken());
	}
}